

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O1

REF_STATUS ref_dict_remove(REF_DICT ref_dict,REF_INT key)

{
  REF_INT *pRVar1;
  REF_STATUS RVar2;
  long lVar3;
  int iVar4;
  REF_INT location;
  int local_c;
  
  RVar2 = ref_dict_location(ref_dict,key,&local_c);
  if (RVar2 == 0) {
    iVar4 = ref_dict->n + -1;
    ref_dict->n = iVar4;
    lVar3 = (long)local_c;
    if (local_c < iVar4) {
      pRVar1 = ref_dict->key;
      do {
        pRVar1[lVar3] = pRVar1[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (lVar3 < ref_dict->n);
    }
    lVar3 = (long)local_c;
    RVar2 = 0;
    if (local_c < ref_dict->n) {
      pRVar1 = ref_dict->value;
      do {
        pRVar1[lVar3] = pRVar1[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (lVar3 < ref_dict->n);
    }
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_dict_remove(REF_DICT ref_dict, REF_INT key) {
  REF_INT i, location;

  RAISE(ref_dict_location(ref_dict, key, &location));

  ref_dict_n(ref_dict)--;

  for (i = location; i < ref_dict_n(ref_dict); i++) {
    ref_dict->key[i] = ref_dict->key[i + 1];
  }
  for (i = location; i < ref_dict_n(ref_dict); i++) {
    ref_dict->value[i] = ref_dict->value[i + 1];
  }

  return REF_SUCCESS;
}